

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<unsigned_char>::Matcher(Matcher<unsigned_char> *this,uchar value)

{
  ComparisonBase<testing::internal::EqMatcher<unsigned_char>,_unsigned_char,_testing::internal::AnyEq>
  local_31;
  Matcher<unsigned_char> local_30;
  uchar local_11;
  Matcher<unsigned_char> *pMStack_10;
  uchar value_local;
  Matcher<unsigned_char> *this_local;
  
  local_11 = value;
  pMStack_10 = this;
  internal::MatcherBase<unsigned_char>::MatcherBase(&this->super_MatcherBase<unsigned_char>);
  (this->super_MatcherBase<unsigned_char>)._vptr_MatcherBase = (_func_int **)&PTR__Matcher_00219b00;
  local_31.rhs_ = (uchar)Eq<unsigned_char>(local_11);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_30,(ComparisonBase *)&local_31);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }